

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::InitializeFromParent(cmMakefile *this,cmMakefile *parent)

{
  PolicyStatus PVar1;
  cmValue cVar2;
  pointer s;
  cmStateSnapshot *this_00;
  cmAlphaNum local_f0;
  cmAlphaNum local_c0;
  cmStateSnapshot *local_90;
  string local_88;
  string defPropName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->SystemIncludeDirectories)._M_t,&(parent->SystemIncludeDirectories)._M_t);
  std::__cxx11::string::_M_assign((string *)&this->DefineFlags);
  std::__cxx11::string::_M_assign((string *)&this->DefineFlagsOrig);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",
             (allocator<char> *)&defPropName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"IMPLICIT_DEPENDS_INCLUDE_TRANSFORM",(allocator<char> *)&local_88);
  cVar2 = GetProperty(parent,(string *)&local_c0);
  SetProperty(this,(string *)&local_f0,cVar2);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_f0);
  this_00 = &this->StateSnapshot;
  PVar1 = cmStateSnapshot::GetPolicy(this_00,CMP0043,false);
  if (PVar1 < NEW) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f0,"COMPILE_DEFINITIONS",(allocator<char> *)&defPropName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,"COMPILE_DEFINITIONS",(allocator<char> *)&local_88);
    local_90 = this_00;
    cVar2 = GetProperty(parent,(string *)&local_c0);
    SetProperty(this,(string *)&local_f0,cVar2);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_f0);
    GetGeneratorConfigs_abi_cxx11_(&configs,this,ExcludeEmptyConfig);
    for (s = configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        s != configs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
      local_f0.View_._M_len = 0x14;
      local_f0.View_._M_str = "COMPILE_DEFINITIONS_";
      cmsys::SystemTools::UpperCase(&local_88,s);
      local_c0.View_._M_len = local_88._M_string_length;
      local_c0.View_._M_str = local_88._M_dataplus._M_p;
      cmStrCat<>(&defPropName,&local_f0,&local_c0);
      std::__cxx11::string::~string((string *)&local_88);
      cVar2 = GetProperty(parent,&defPropName);
      SetProperty(this,&defPropName,cVar2);
      std::__cxx11::string::~string((string *)&defPropName);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configs);
    this_00 = local_90;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"LABELS",(allocator<char> *)&defPropName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"LABELS",(allocator<char> *)&local_88);
  cVar2 = GetProperty(parent,(string *)&local_c0);
  SetProperty(this,(string *)&local_f0,cVar2);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"LINK_LIBRARIES",(allocator<char> *)&defPropName);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"LINK_LIBRARIES",(allocator<char> *)&local_88);
  cVar2 = GetProperty(parent,(string *)&local_c0);
  SetProperty(this,(string *)&local_f0,cVar2);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_f0);
  cmStateSnapshot::GetProjectName_abi_cxx11_((string *)&local_f0,&parent->StateSnapshot);
  cmStateSnapshot::SetProjectName(this_00,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::_M_assign((string *)&this->ComplainFileRegularExpression);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(this->ImportedTargets)._M_h,&(parent->ImportedTargets)._M_h);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&(this->AliasTargets)._M_t,&(parent->AliasTargets)._M_t);
  this->RecursionDepth = parent->RecursionDepth;
  return;
}

Assistant:

void cmMakefile::InitializeFromParent(cmMakefile* parent)
{
  this->SystemIncludeDirectories = parent->SystemIncludeDirectories;

  // define flags
  this->DefineFlags = parent->DefineFlags;
  this->DefineFlagsOrig = parent->DefineFlagsOrig;

  // Include transform property.  There is no per-config version.
  {
    const char* prop = "IMPLICIT_DEPENDS_INCLUDE_TRANSFORM";
    this->SetProperty(prop, parent->GetProperty(prop));
  }

  // compile definitions property and per-config versions
  cmPolicies::PolicyStatus polSt = this->GetPolicyStatus(cmPolicies::CMP0043);
  if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
    this->SetProperty("COMPILE_DEFINITIONS",
                      parent->GetProperty("COMPILE_DEFINITIONS"));
    std::vector<std::string> configs =
      this->GetGeneratorConfigs(cmMakefile::ExcludeEmptyConfig);
    for (std::string const& config : configs) {
      std::string defPropName =
        cmStrCat("COMPILE_DEFINITIONS_", cmSystemTools::UpperCase(config));
      cmValue prop = parent->GetProperty(defPropName);
      this->SetProperty(defPropName, prop);
    }
  }

  // labels
  this->SetProperty("LABELS", parent->GetProperty("LABELS"));

  // link libraries
  this->SetProperty("LINK_LIBRARIES", parent->GetProperty("LINK_LIBRARIES"));

  // the initial project name
  this->StateSnapshot.SetProjectName(parent->StateSnapshot.GetProjectName());

  // Copy include regular expressions.
  this->ComplainFileRegularExpression = parent->ComplainFileRegularExpression;

  // Imported targets.
  this->ImportedTargets = parent->ImportedTargets;

  // Non-global Alias targets.
  this->AliasTargets = parent->AliasTargets;

  // Recursion depth.
  this->RecursionDepth = parent->RecursionDepth;
}